

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryRemove(InMemoryDirectory *this,PathPtr path)

{
  size_t sVar1;
  Disposer DVar2;
  undefined1 uVar3;
  iterator iVar4;
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
  *this_00;
  Predicate *pPVar5;
  size_t sVar6;
  char *pcVar7;
  String *pSVar8;
  _Link_type __p;
  StringPtr name;
  Fault f;
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  FsNode local_30;
  Disposer local_28;
  
  sVar6 = path.parts.size_;
  pSVar8 = path.parts.ptr;
  if (sVar6 == 1) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&f,&this->impl);
    sVar6 = (pSVar8->content).size_;
    if (sVar6 == 0) {
      local_30._vptr_FsNode = (_func_int **)0x1e847a;
    }
    else {
      local_30._vptr_FsNode = (_func_int **)(pSVar8->content).ptr;
    }
    local_28._vptr_Disposer = (_func_int **)(sVar6 + (sVar6 == 0));
    iVar4 = std::
            map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
            ::find((map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
                    *)&(local_38.ptr)->predicate,(key_type *)&stack0xffffffffffffffd0);
    __p = (_Link_type)&(local_38.ptr)->exception;
    uVar3 = (_Link_type)iVar4._M_node != __p;
    if ((bool)uVar3) {
      this_00 = (_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
                 *)std::_Rb_tree_rebalance_for_erase(iVar4._M_node,(_Rb_tree_node_base *)__p);
      std::
      _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
      ::_M_drop_node(this_00,__p);
      local_38.ptr[1].prev =
           (Maybe<kj::_::Mutex::Waiter_&> *)((long)&local_38.ptr[1].prev[-1].ptr + 7);
      pPVar5 = (Predicate *)(*(code *)((((((local_38.ptr)->next).ptr)->next).ptr)->next).ptr)();
      local_38.ptr[1].predicate = pPVar5;
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&f);
  }
  else if (sVar6 == 0) {
    uVar3 = 0;
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x587,FAILED,(char *)0x0,"\"can\'t remove self from self\"",
               (char (*) [28])"can\'t remove self from self");
    _::Debug::Fault::~Fault(&f);
  }
  else {
    sVar1 = (pSVar8->content).size_;
    if (sVar1 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar8->content).ptr;
    }
    name.content.size_ = (size_t)pcVar7;
    name.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffd0,name,(int)sVar1 + (uint)(sVar1 == 0))
    ;
    DVar2._vptr_Disposer = local_28._vptr_Disposer;
    f.exception = (Exception *)local_30._vptr_FsNode;
    local_28._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)&stack0xffffffffffffffd0);
    if ((Clock *)DVar2._vptr_Disposer == (Clock *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*DVar2._vptr_Disposer + 0xb0))(DVar2._vptr_Disposer,pSVar8 + 1,sVar6 - 1)
      ;
    }
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)&f);
  }
  return (bool)uVar3;
}

Assistant:

bool tryRemove(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't remove self from self") { return false; }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      auto iter = lock->entries.find(path[0]);
      if (iter == lock->entries.end()) {
        return false;
      } else {
        lock->entries.erase(iter);
        lock->modified();
        return true;
      }
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], WriteMode::MODIFY)) {
        return child->tryRemove(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }